

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::complete(Molecule *this)

{
  pointer *pppAVar1;
  pointer *pppHVar2;
  const_iterator __position;
  iterator iVar3;
  Atom *pAVar4;
  AtomType *this_00;
  iterator iVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  int iVar8;
  RigidBody *pRVar9;
  pointer ppAVar10;
  Bond *pBVar11;
  pointer ppRVar12;
  pointer ppRVar13;
  pointer ppAVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  const_iterator cVar17;
  Atom *pAVar18;
  pointer ppBVar19;
  string bn2;
  string bn;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb2;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb1;
  set<OpenMD::Atom_*,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_> rigidAtoms;
  RigidBody *local_110;
  string local_108;
  undefined1 local_e8 [32];
  Atom *local_c8;
  string local_c0;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_a0;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_88;
  pointer local_70;
  vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>> *local_68;
  undefined1 local_60 [40];
  size_t local_38;
  
  __position._M_node = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (_Base_ptr)0x0;
  local_38 = 0;
  ppRVar13 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppRVar12 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60._24_8_ = __position._M_node;
  local_60._32_8_ = __position._M_node;
  if ((ppRVar13 != ppRVar12) && (pRVar9 = *ppRVar13, pRVar9 != (RigidBody *)0x0)) {
    do {
      ppAVar14 = (pRVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar10 = (pRVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_e8._0_8_ = (RigidBody *)local_60;
      if (ppAVar14 != ppAVar10) {
        do {
          std::
          _Rb_tree<OpenMD::Atom*,OpenMD::Atom*,std::_Identity<OpenMD::Atom*>,std::less<OpenMD::Atom*>,std::allocator<OpenMD::Atom*>>
          ::
          _M_insert_unique_<OpenMD::Atom*&,std::_Rb_tree<OpenMD::Atom*,OpenMD::Atom*,std::_Identity<OpenMD::Atom*>,std::less<OpenMD::Atom*>,std::allocator<OpenMD::Atom*>>::_Alloc_node>
                    ((_Rb_tree<OpenMD::Atom*,OpenMD::Atom*,std::_Identity<OpenMD::Atom*>,std::less<OpenMD::Atom*>,std::allocator<OpenMD::Atom*>>
                      *)local_60,__position,ppAVar14,(_Alloc_node *)local_e8);
          ppAVar14 = ppAVar14 + 1;
        } while (ppAVar14 != ppAVar10);
        ppRVar12 = (this->rigidBodies_).
                   super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      ppRVar13 = ppRVar13 + 1;
    } while ((ppRVar13 != ppRVar12) && (pRVar9 = *ppRVar13, pRVar9 != (RigidBody *)0x0));
  }
  ppAVar14 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppAVar10 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar14 == ppAVar10) {
    local_110 = (RigidBody *)0x0;
  }
  else {
    local_110 = (RigidBody *)*ppAVar14;
    if (local_110 != (RigidBody *)0x0) {
      do {
        p_Var6 = (_Base_ptr)local_60._16_8_;
        cVar17._M_node = __position._M_node;
        if ((_Base_ptr)local_60._16_8_ == (_Base_ptr)0x0) {
LAB_002035d9:
          local_e8._0_8_ = local_110;
          std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
          emplace_back<OpenMD::StuntDouble*>
                    ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                     &this->integrableObjects_,(StuntDouble **)local_e8);
          ppAVar10 = (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        else {
          do {
            p_Var16 = cVar17._M_node;
            p_Var15 = p_Var6;
            pRVar9 = *(RigidBody **)(p_Var15 + 1);
            cVar17._M_node = p_Var15;
            if (pRVar9 < local_110) {
              cVar17._M_node = p_Var16;
            }
            p_Var6 = (&p_Var15->_M_left)[pRVar9 < local_110];
          } while ((&p_Var15->_M_left)[pRVar9 < local_110] != (_Base_ptr)0x0);
          if (cVar17._M_node == __position._M_node) goto LAB_002035d9;
          if (pRVar9 < local_110) {
            p_Var15 = p_Var16;
          }
          if (local_110 < *(RigidBody **)(p_Var15 + 1)) goto LAB_002035d9;
        }
        ppAVar14 = ppAVar14 + 1;
      } while ((ppAVar14 != ppAVar10) &&
              (local_110 = (RigidBody *)*ppAVar14, local_110 != (RigidBody *)0x0));
      local_110 = (RigidBody *)0x0;
      ppRVar12 = (this->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  ppRVar13 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((ppRVar13 != ppRVar12) && (pRVar9 = *ppRVar13, pRVar9 != (RigidBody *)0x0)) {
    do {
      ppRVar13 = ppRVar13 + 1;
      local_e8._0_8_ = pRVar9;
      std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
      emplace_back<OpenMD::StuntDouble*>
                ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)
                 &this->integrableObjects_,(StuntDouble **)local_e8);
      if (ppRVar13 ==
          (this->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      pRVar9 = *ppRVar13;
    } while (pRVar9 != (RigidBody *)0x0);
    ppAVar10 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  ppAVar14 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ppAVar14 != ppAVar10) && (local_110 = (RigidBody *)*ppAVar14, local_110 != (RigidBody *)0x0))
  {
    do {
      ppAVar14 = ppAVar14 + 1;
      bVar7 = AtomType::isFluctuatingCharge((AtomType *)(local_110->name_)._M_dataplus._M_p);
      if (bVar7) {
        iVar3._M_current =
             (this->fluctuatingCharges_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->fluctuatingCharges_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::
          _M_realloc_insert<OpenMD::Atom*const&>
                    ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)
                     &this->fluctuatingCharges_,iVar3,(Atom **)&local_110);
        }
        else {
          *iVar3._M_current = (Atom *)local_110;
          pppAVar1 = &(this->fluctuatingCharges_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
      }
      ppAVar10 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while ((ppAVar14 != ppAVar10) &&
            (local_110 = (RigidBody *)*ppAVar14, local_110 != (RigidBody *)0x0));
    ppAVar14 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppAVar14 == ppAVar10) {
LAB_00203867:
    local_110 = (RigidBody *)0x0;
  }
  else {
    local_110 = (RigidBody *)*ppAVar14;
    if (local_110 != (RigidBody *)0x0) {
      local_c8 = (Atom *)&this->hBondAcceptors_;
      do {
        ppAVar14 = ppAVar14 + 1;
        AtomType::allYourBase
                  ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_c0,
                   (AtomType *)(local_110->name_)._M_dataplus._M_p);
        AtomType::getName_abi_cxx11_(&local_108,*(AtomType **)(local_c0._M_string_length - 8));
        UpperCase((string *)local_e8,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        iVar8 = std::__cxx11::string::compare((char *)local_e8);
        if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)local_e8), iVar8 == 0))
           || (iVar8 = std::__cxx11::string::compare((char *)local_e8), iVar8 == 0)) {
          iVar3._M_current =
               (this->hBondAcceptors_).
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::
            _M_realloc_insert<OpenMD::Atom*const&>
                      ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)local_c8,iVar3,
                       (Atom **)&local_110);
          }
          else {
            *iVar3._M_current = (Atom *)local_110;
            pppAVar1 = &(this->hBondAcceptors_).
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppAVar1 = *pppAVar1 + 1;
          }
        }
        if ((RigidBody *)local_e8._0_8_ != (RigidBody *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
        }
        if ((HBondDonor *)local_c0._M_dataplus._M_p != (HBondDonor *)0x0) {
          operator_delete(local_c0._M_dataplus._M_p,
                          local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
        }
        if (ppAVar14 ==
            (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00203867;
        local_110 = (RigidBody *)*ppAVar14;
      } while (local_110 != (RigidBody *)0x0);
      local_110 = (RigidBody *)0x0;
    }
  }
  ppBVar19 = (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((ppBVar19 !=
       (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (pBVar11 = *ppBVar19, pBVar11 != (Bond *)0x0)) {
    local_c8 = (Atom *)&this->hBondDonors_;
    do {
      ppBVar19 = ppBVar19 + 1;
      ppAVar14 = (pBVar11->super_ShortRangeInteraction).atoms_.
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pAVar18 = *ppAVar14;
      pAVar4 = ppAVar14[1];
      this_00 = pAVar4->atomType_;
      AtomType::allYourBase(&local_88,pAVar18->atomType_);
      AtomType::allYourBase(&local_a0,this_00);
      AtomType::getName_abi_cxx11_
                (&local_108,
                 local_88.
                 super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
                 .super__Vector_impl_data._M_finish[-1]);
      UpperCase((string *)local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      AtomType::getName_abi_cxx11_
                (&local_c0,
                 local_a0.
                 super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl
                 .super__Vector_impl_data._M_finish[-1]);
      UpperCase(&local_108,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      iVar8 = std::__cxx11::string::compare((char *)local_e8);
      if ((iVar8 == 0) &&
         (((iVar8 = std::__cxx11::string::compare((char *)&local_108), iVar8 == 0 ||
           (iVar8 = std::__cxx11::string::compare((char *)&local_108), iVar8 == 0)) ||
          (iVar8 = std::__cxx11::string::compare((char *)&local_108), iVar8 == 0)))) {
        local_c0._M_dataplus._M_p = (pointer)operator_new(0x10);
        ((HBondDonor *)local_c0._M_dataplus._M_p)->donorAtom = pAVar4;
        ((HBondDonor *)local_c0._M_dataplus._M_p)->donatedHydrogen = pAVar18;
        iVar5._M_current =
             (this->hBondDonors_).
             super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>::
          _M_realloc_insert<OpenMD::Molecule::HBondDonor*const&>
                    ((vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>
                      *)local_c8,iVar5,(HBondDonor **)&local_c0);
        }
        else {
          *iVar5._M_current = (HBondDonor *)local_c0._M_dataplus._M_p;
          pppHVar2 = &(this->hBondDonors_).
                      super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppHVar2 = *pppHVar2 + 1;
        }
      }
      iVar8 = std::__cxx11::string::compare((char *)&local_108);
      if ((iVar8 == 0) &&
         (((iVar8 = std::__cxx11::string::compare((char *)local_e8), iVar8 == 0 ||
           (iVar8 = std::__cxx11::string::compare((char *)local_e8), iVar8 == 0)) ||
          (iVar8 = std::__cxx11::string::compare((char *)local_e8), iVar8 == 0)))) {
        local_c0._M_dataplus._M_p = (pointer)operator_new(0x10);
        ((HBondDonor *)local_c0._M_dataplus._M_p)->donorAtom = pAVar18;
        ((HBondDonor *)local_c0._M_dataplus._M_p)->donatedHydrogen = pAVar4;
        iVar5._M_current =
             (this->hBondDonors_).
             super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>::
          _M_realloc_insert<OpenMD::Molecule::HBondDonor*const&>
                    ((vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>
                      *)local_c8,iVar5,(HBondDonor **)&local_c0);
        }
        else {
          *iVar5._M_current = (HBondDonor *)local_c0._M_dataplus._M_p;
          pppHVar2 = &(this->hBondDonors_).
                      super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppHVar2 = *pppHVar2 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((RigidBody *)local_e8._0_8_ != (RigidBody *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      if (local_a0.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((ppBVar19 !=
              (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) &&
            (pBVar11 = *ppBVar19, pBVar11 != (Bond *)0x0));
  }
  ppRVar13 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppRVar12 = (this->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((ppRVar13 != ppRVar12) && (pRVar9 = *ppRVar13, pRVar9 != (RigidBody *)0x0)) {
    local_68 = (vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>
                *)&this->hBondDonors_;
    do {
      ppAVar14 = (pRVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((ppAVar14 !=
           (pRVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         (pAVar18 = *ppAVar14, pAVar18 != (Atom *)0x0)) {
        do {
          local_70 = ppRVar13;
          AtomType::allYourBase(&local_88,pAVar18->atomType_);
          AtomType::getName_abi_cxx11_
                    (&local_108,
                     local_88.
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1]);
          UpperCase((string *)local_e8,&local_108);
          local_c8 = pAVar18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          iVar8 = std::__cxx11::string::compare(local_e8);
          if ((((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare(local_e8), iVar8 == 0)) ||
              (iVar8 = std::__cxx11::string::compare(local_e8), iVar8 == 0)) &&
             (ppAVar10 = (pRVar9->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start,
             ppAVar10 !=
             (pRVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish)) {
            pAVar18 = *ppAVar10;
            while (pAVar18 != (Atom *)0x0) {
              ppAVar10 = ppAVar10 + 1;
              AtomType::allYourBase(&local_a0,pAVar18->atomType_);
              AtomType::getName_abi_cxx11_
                        (&local_c0,
                         local_a0.
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]);
              UpperCase(&local_108,&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              iVar8 = std::__cxx11::string::compare((char *)&local_108);
              if (iVar8 == 0) {
                local_c0._M_dataplus._M_p = (pointer)operator_new(0x10);
                ((HBondDonor *)local_c0._M_dataplus._M_p)->donorAtom = local_c8;
                ((HBondDonor *)local_c0._M_dataplus._M_p)->donatedHydrogen = pAVar18;
                iVar5._M_current =
                     (this->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->hBondDonors_).
                    super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<OpenMD::Molecule::HBondDonor*,std::allocator<OpenMD::Molecule::HBondDonor*>>
                  ::_M_realloc_insert<OpenMD::Molecule::HBondDonor*const&>
                            (local_68,iVar5,(HBondDonor **)&local_c0);
                }
                else {
                  *iVar5._M_current = (HBondDonor *)local_c0._M_dataplus._M_p;
                  pppHVar2 = &(this->hBondDonors_).
                              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppHVar2 = *pppHVar2 + 1;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if (local_a0.
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_a0.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_a0.
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_a0.
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (ppAVar10 ==
                  (pRVar9->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
              pAVar18 = *ppAVar10;
            }
          }
          if ((RigidBody *)local_e8._0_8_ != (RigidBody *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
          }
          if (local_88.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          ppAVar14 = ppAVar14 + 1;
          ppRVar13 = local_70;
        } while ((ppAVar14 !=
                  (pRVar9->atoms_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) &&
                (pAVar18 = *ppAVar14, pAVar18 != (Atom *)0x0));
        ppRVar12 = (this->rigidBodies_).
                   super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      ppRVar13 = ppRVar13 + 1;
    } while ((ppRVar13 != ppRVar12) && (pRVar9 = *ppRVar13, pRVar9 != (RigidBody *)0x0));
  }
  std::
  _Rb_tree<OpenMD::Atom_*,_OpenMD::Atom_*,_std::_Identity<OpenMD::Atom_*>,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>
  ::~_Rb_tree((_Rb_tree<OpenMD::Atom_*,_OpenMD::Atom_*,_std::_Identity<OpenMD::Atom_*>,_std::less<OpenMD::Atom_*>,_std::allocator<OpenMD::Atom_*>_>
               *)local_60);
  return;
}

Assistant:

void Molecule::complete() {
    std::set<Atom*> rigidAtoms;
    Atom* atom;
    Atom* atom1;
    Atom* atom2;
    AtomIterator ai, aj;
    RigidBody* rb;
    RigidBodyIterator rbIter;
    Bond* bond;
    BondIterator bi;

    // Get list of all the atoms that are part of rigid bodies

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      rigidAtoms.insert(rb->getBeginAtomIter(), rb->getEndAtomIter());
    }

    // add any atom that wasn't part of a rigid body to the list of
    // integrableObjects

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      if (rigidAtoms.find(atom) == rigidAtoms.end()) {
        // If an atom does not belong to a rigid body, it is an
        // integrable object

        integrableObjects_.push_back(atom);
      }
    }

    // then add the rigid bodies themselves to the integrableObjects

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      integrableObjects_.push_back(rb);
    }

    // find the atoms that are fluctuating charges and add them to the
    // fluctuatingCharges_ vector

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      if (atom->isFluctuatingCharge()) fluctuatingCharges_.push_back(atom);
    }

    // find the electronegative atoms and add them to the
    // hBondAcceptors_ vector:

    for (atom = beginAtom(ai); atom != NULL; atom = nextAtom(ai)) {
      AtomType* at = atom->getAtomType();
      // get the chain of base types for this atom type:
      std::vector<AtomType*> ayb = at->allYourBase();
      // use the last type in the chain of base types for the name:
      std::string bn = UpperCase(ayb[ayb.size() - 1]->getName());

      if (bn.compare("O") == 0 || bn.compare("N") == 0 || bn.compare("F") == 0)
        hBondAcceptors_.push_back(atom);
    }

    // find electronegative atoms that are either bonded to
    // hydrogens or are present in the same rigid bodies:

    for (bond = beginBond(bi); bond != NULL; bond = nextBond(bi)) {
      Atom* atom1   = bond->getAtomA();
      Atom* atom2   = bond->getAtomB();
      AtomType* at1 = atom1->getAtomType();
      AtomType* at2 = atom2->getAtomType();
      // get the chain of base types for this atom type:
      std::vector<AtomType*> ayb1 = at1->allYourBase();
      std::vector<AtomType*> ayb2 = at2->allYourBase();
      // use the last type in the chain of base types for the name:
      std::string bn1 = UpperCase(ayb1[ayb1.size() - 1]->getName());
      std::string bn2 = UpperCase(ayb2[ayb2.size() - 1]->getName());

      if (bn1.compare("H") == 0) {
        if (bn2.compare("O") == 0 || bn2.compare("N") == 0 ||
            bn2.compare("F") == 0) {
          HBondDonor* donor      = new HBondDonor();
          donor->donorAtom       = atom2;
          donor->donatedHydrogen = atom1;
          hBondDonors_.push_back(donor);
        }
      }
      if (bn2.compare("H") == 0) {
        if (bn1.compare("O") == 0 || bn1.compare("N") == 0 ||
            bn1.compare("F") == 0) {
          HBondDonor* donor      = new HBondDonor();
          donor->donorAtom       = atom1;
          donor->donatedHydrogen = atom2;
          hBondDonors_.push_back(donor);
        }
      }
    }

    for (rb = beginRigidBody(rbIter); rb != NULL; rb = nextRigidBody(rbIter)) {
      for (atom1 = rb->beginAtom(ai); atom1 != NULL; atom1 = rb->nextAtom(ai)) {
        AtomType* at1 = atom1->getAtomType();
        // get the chain of base types for this atom type:
        std::vector<AtomType*> ayb1 = at1->allYourBase();
        // use the last type in the chain of base types for the name:
        std::string bn1 = UpperCase(ayb1[ayb1.size() - 1]->getName());

        if (bn1.compare("O") == 0 || bn1.compare("N") == 0 ||
            bn1.compare("F") == 0) {
          for (atom2 = rb->beginAtom(aj); atom2 != NULL;
               atom2 = rb->nextAtom(aj)) {
            AtomType* at2 = atom2->getAtomType();
            // get the chain of base types for this atom type:
            std::vector<AtomType*> ayb2 = at2->allYourBase();
            // use the last type in the chain of base types for the name:
            std::string bn2 = UpperCase(ayb2[ayb2.size() - 1]->getName());
            if (bn2.compare("H") == 0) {
              HBondDonor* donor      = new HBondDonor();
              donor->donorAtom       = atom1;
              donor->donatedHydrogen = atom2;
              hBondDonors_.push_back(donor);
            }
          }
        }
      }
    }
  }